

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdIsTrue<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,(unsigned_char)1>(Thread *this)

{
  uint *puVar1;
  uint *puVar2;
  difference_type dVar3;
  undefined1 local_20 [8];
  Simd<unsigned_int,_(unsigned_char)__x04_> val;
  Thread *this_local;
  
  val.v._8_8_ = this;
  _local_20 = Pop<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this);
  puVar1 = std::begin<unsigned_int,4ul>((uint (*) [4])local_20);
  puVar2 = std::end<unsigned_int,4ul>((uint (*) [4])local_20);
  dVar3 = std::
          count_if<unsigned_int*,wabt::interp::Thread::DoSimdIsTrue<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,(unsigned_char)1>()::_lambda(unsigned_int)_1_>
                    (puVar1,puVar2);
  Push<bool>(this,0 < dVar3);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdIsTrue() {
  using L = typename S::LaneType;
  auto val = Pop<S>();
  Push(std::count_if(std::begin(val.v), std::end(val.v),
                     [](L x) { return x != 0; }) >= count);
  return RunResult::Ok;
}